

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_passthrough_resampler_fill_input_left_Test::TestBody
          (cubeb_passthrough_resampler_fill_input_left_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  AssertionResult gtest_ar;
  int iteration;
  long input_frame_count;
  long output_frame_count;
  long got;
  passthrough_resampler<float> resampler;
  float output [64];
  float input [96];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  internal local_318 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  undefined4 local_304;
  long local_300;
  AssertHelper local_2f8;
  long local_2f0;
  long local_2e8;
  passthrough_resampler<float> local_2e0;
  undefined1 local_298 [256];
  undefined8 local_198 [48];
  int iVar8;
  int iVar10;
  
  local_304 = 0;
  lVar3 = 0;
  passthrough_resampler<float>::passthrough_resampler
            (&local_2e0,(cubeb_stream *)0x0,passthrough_resampler_fill_input_left,&local_304,2,
             0xac44);
  local_300 = 0x30;
  local_2f0 = 0x20;
  memset(local_198,0,0x180);
  memset(local_298,0,0x100);
  uVar5 = 0x100000000;
  uVar6 = 0x300000002;
  do {
    auVar7._0_8_ = uVar6 & 0xffffffff;
    iVar8 = (int)(uVar6 >> 0x20);
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = 0;
    iVar10 = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5 & 0xffffffff;
    auVar9._8_4_ = iVar10;
    auVar9._12_4_ = 0;
    *(ulong *)((long)local_198 + lVar3 * 4) =
         CONCAT44((float)((SUB168(auVar9 | _DAT_001320c0,8) - DAT_001320c0._8_8_) * 0.01),
                  (float)((SUB168(auVar9 | _DAT_001320c0,0) - (double)DAT_001320c0) * 0.01));
    *(ulong *)((long)local_198 + lVar3 * 4 + 8) =
         CONCAT44((float)((SUB168(auVar7 | _DAT_001320c0,8) - DAT_001320c0._8_8_) * 0.01),
                  (float)((SUB168(auVar7 | _DAT_001320c0,0) - (double)DAT_001320c0) * 0.01));
    lVar3 = lVar3 + 4;
    uVar5 = CONCAT44(iVar10 + 4,(int)uVar5 + 4);
    uVar6 = CONCAT44(iVar8 + 4,(int)uVar6 + 4);
  } while (lVar3 != 0x60);
  local_304 = 1;
  local_2e8 = passthrough_resampler<float>::fill(&local_2e0,local_198,&local_300,local_298,0x20);
  testing::internal::CmpHelperEQ<long,long>
            (local_318,"got","output_frame_count",&local_2e8,&local_2f0);
  if (local_318[0] == (internal)0x0) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    iVar8 = 0x416;
    local_320.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<long,long>
              (local_318,"input_frame_count","output_frame_count",&local_300,&local_2f0);
    if (local_318[0] == (internal)0x0) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
      }
      iVar8 = 0x418;
      local_320.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_300 = 0x20;
      local_304 = 2;
      local_2e8 = passthrough_resampler<float>::fill(&local_2e0,local_198,&local_300,local_298,0x20)
      ;
      testing::internal::CmpHelperEQ<long,long>
                (local_318,"got","output_frame_count",&local_2e8,&local_2f0);
      if (local_318[0] == (internal)0x0) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_310.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
        }
        iVar8 = 0x41f;
        local_320.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        testing::internal::CmpHelperEQ<long,long>
                  (local_318,"input_frame_count","output_frame_count",&local_300,&local_2f0);
        if (local_318[0] == (internal)0x0) {
          psVar2 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar2);
          *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_310.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
          }
          iVar8 = 0x421;
          local_320.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_310,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_300 = 8;
          local_304 = 3;
          local_2e8 = passthrough_resampler<float>::fill
                                (&local_2e0,local_198,&local_300,local_298,0x20);
          testing::internal::CmpHelperEQ<long,long>
                    (local_318,"got","output_frame_count",&local_2e8,&local_2f0);
          if (local_318[0] != (internal)0x0) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_310,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_320.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DAT_00000018;
            testing::internal::CmpHelperEQ<long,long>
                      (local_318,"input_frame_count","output_frame_count - 8",&local_300,
                       (long *)&local_320);
            if (local_318[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_320);
              if (local_310.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                         ,0x42a,pcVar4);
              testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_320);
              testing::internal::AssertHelper::~AssertHelper(&local_2f8);
              if (((local_320.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
                 (local_320.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_320.ptr_ + 8))();
              }
            }
            goto LAB_0010b9a8;
          }
          psVar2 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar2);
          *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_310.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
          }
          iVar8 = 0x428;
          local_320.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_2f8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,iVar8,pcVar4);
  testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_320);
  testing::internal::AssertHelper::~AssertHelper(&local_2f8);
  if (((local_320.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_320.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_320.ptr_ + 8))();
  }
LAB_0010b9a8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e0.super_cubeb_resampler._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00148000;
  if (local_2e0.internal_input_buffer.data_ != (float *)0x0) {
    operator_delete__(local_2e0.internal_input_buffer.data_);
  }
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_input_left) {
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  int iteration = 0;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_input_left,
                                 &iteration, channels, sample_rate);

  long input_frame_count = 48; // 32 + 16
  const long output_frame_count = 32;
  float input[96] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }

  // 1st iteration, add the extra input.
  iteration = 1;
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 2st iteration, use the extra input from previous iteration,
  // 16 frames are remaining in the input buffer.
  input_frame_count = 32; // we need 16 input frames but we get more;
  iteration = 2;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 3rd iteration, use the extra input from previous iteration.
  // 16 frames are remaining in the input buffer.
  input_frame_count = 16 - 8; // We need 16 more input frames but we only get 8.
  iteration = 3;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 8);
}